

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_ToInt64Clamp(JSContext *ctx,int64_t *pres,JSValue val,int64_t min,int64_t max,
                   int64_t neg_offset)

{
  JSValue val_00;
  JSValue v;
  int iVar1;
  int64_t in_RCX;
  JSValueUnion in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSContext *in_R8;
  int64_t *in_R9;
  long in_stack_00000008;
  int res;
  
  v.tag = in_RCX;
  v.u.float64 = in_RDX.float64;
  JS_DupValue(in_RDI,v);
  val_00.tag = (int64_t)in_RDI;
  val_00.u.ptr = in_RSI.ptr;
  iVar1 = JS_ToInt64SatFree(in_R8,in_R9,val_00);
  if (iVar1 == 0) {
    if (*in_RSI.ptr < 0) {
      *(long *)in_RSI.ptr = in_stack_00000008 + *in_RSI.ptr;
    }
    if (*in_RSI.ptr < (long)in_R8) {
      *(JSContext **)in_RSI.ptr = in_R8;
    }
    else if ((long)in_R9 < *in_RSI.ptr) {
      *(int64_t **)in_RSI.ptr = in_R9;
    }
  }
  return iVar1;
}

Assistant:

int JS_ToInt64Clamp(JSContext *ctx, int64_t *pres, JSValueConst val,
                    int64_t min, int64_t max, int64_t neg_offset)
{
    int res = JS_ToInt64SatFree(ctx, pres, JS_DupValue(ctx, val));
    if (res == 0) {
        if (*pres < 0)
            *pres += neg_offset;
        if (*pres < min)
            *pres = min;
        else if (*pres > max)
            *pres = max;
    }
    return res;
}